

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,void *dictStart,
              size_t dictSize)

{
  byte bVar1;
  uint uVar2;
  U16 UVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  size_t __n;
  ulong __n_00;
  BYTE *pBVar6;
  BYTE *pBVar7;
  BYTE *pBVar8;
  bool bVar9;
  size_t local_238;
  ulong local_230;
  long local_220;
  size_t dictSize_local;
  void *dictStart_local;
  int maxOutputSize_local;
  int compressedSize_local;
  char *dest_local;
  char *source_local;
  BYTE *oCopyLimit;
  BYTE *copyEnd;
  BYTE *matchEnd;
  size_t mlen;
  BYTE *copyFrom;
  BYTE *endOfMatch;
  size_t restSize;
  size_t copySize;
  size_t addl_1;
  size_t addl;
  size_t length;
  ulong uStack_190;
  uint token;
  size_t offset;
  BYTE *match;
  BYTE *shortoend;
  BYTE *shortiend;
  int checkOffset;
  BYTE *dictEnd;
  BYTE *cpy;
  BYTE *oend;
  BYTE *op;
  BYTE *iend;
  BYTE *ip;
  void *local_130;
  BYTE *local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  char *local_110;
  char *local_108;
  int local_fc;
  BYTE *local_f8;
  BYTE *e_1;
  BYTE *s_3;
  BYTE *d_1;
  size_t local_d8;
  BYTE *local_d0;
  BYTE *local_c8;
  BYTE *e_2;
  BYTE *s_4;
  BYTE *d_2;
  BYTE *local_a8;
  BYTE *local_a0;
  BYTE *local_98;
  BYTE *e;
  BYTE *s_1;
  BYTE *d;
  BYTE *local_78;
  BYTE *local_70;
  long local_68;
  Rvl_t length_1;
  Rvl_t s;
  BYTE *local_50;
  BYTE **local_48;
  long local_40;
  long local_38;
  Rvl_t length_2;
  Rvl_t s_2;
  BYTE *local_20;
  BYTE **local_18;
  long local_10;
  
  local_11c = 0;
  local_120 = 2;
  if ((source == (char *)0x0) || (maxOutputSize < 0)) {
    local_fc = -1;
  }
  else {
    pBVar4 = (BYTE *)(source + compressedSize);
    pBVar5 = (BYTE *)(dest + maxOutputSize);
    if (dictStart == (void *)0x0) {
      local_220 = 0;
    }
    else {
      local_220 = (long)dictStart + dictSize;
    }
    if (maxOutputSize == 0) {
      bVar9 = false;
      if (compressedSize == 1) {
        bVar9 = *source == '\0';
      }
      local_fc = -1;
      if (bVar9) {
        local_fc = 0;
      }
    }
    else {
      pBVar8 = (BYTE *)dest;
      iend = (BYTE *)source;
      ip = (BYTE *)dictSize;
      local_130 = dictStart;
      local_128 = (BYTE *)dest;
      local_118 = maxOutputSize;
      local_114 = compressedSize;
      local_110 = dest;
      local_108 = source;
      if (compressedSize == 0) {
        local_fc = -1;
      }
      else {
LAB_004e9e8e:
        oend = pBVar8;
        pBVar8 = iend + 1;
        bVar1 = *iend;
        addl = (size_t)(bVar1 >> 4);
        if ((addl == 0xf) || (pBVar4 + -0x10 <= pBVar8 || pBVar5 + -0x20 < oend)) {
          iend = pBVar8;
          if (addl == 0xf) {
            local_50 = pBVar4 + -0xf;
            local_48 = &iend;
            s._4_4_ = 1;
            local_68 = 0;
            if (pBVar8 < local_50) {
              do {
                length_1 = (Rvl_t)**local_48;
                *local_48 = *local_48 + 1;
                local_68 = length_1 + local_68;
                if (local_50 < *local_48) {
                  local_40 = -1;
                  break;
                }
                local_40 = local_68;
              } while (length_1 == 0xff);
            }
            else {
              local_40 = -1;
            }
            if (((local_40 == -1) || (addl = local_40 + 0xf, oend + addl < oend)) ||
               (iend + addl < iend)) goto LAB_004eac20;
          }
          dictEnd = oend + addl;
          if ((pBVar5 + -0xc < dictEnd) || (pBVar4 + -8 < iend + addl)) {
            if (local_11c == 0) {
              if ((iend + addl != pBVar4) || (pBVar5 < dictEnd)) goto LAB_004eac20;
            }
            else {
              if (pBVar4 < iend + addl) {
                addl = (long)pBVar4 - (long)iend;
                dictEnd = oend + addl;
              }
              if (pBVar5 < dictEnd) {
                addl = (long)pBVar5 - (long)oend;
                dictEnd = pBVar5;
              }
            }
            memmove(oend,iend,addl);
            iend = iend + addl;
            oend = oend + addl;
            if (((local_11c == 0) || (dictEnd == pBVar5)) || (pBVar4 + -2 <= iend))
            goto LAB_004eac07;
          }
          else {
            local_70 = oend;
            local_78 = iend;
            s_1 = oend;
            e = iend;
            do {
              *(undefined8 *)s_1 = *(undefined8 *)e;
              s_1 = s_1 + 8;
              e = e + 8;
            } while (s_1 < dictEnd);
            iend = iend + addl;
            oend = dictEnd;
            local_98 = dictEnd;
            d = dictEnd;
          }
          UVar3 = LZ4_readLE16(iend);
          uStack_190 = (ulong)UVar3;
          iend = iend + 2;
          offset = (long)oend - uStack_190;
          addl = (size_t)(bVar1 & 0xf);
        }
        else {
          *(undefined8 *)oend = *(undefined8 *)pBVar8;
          *(undefined8 *)(oend + 8) = *(undefined8 *)(iend + 9);
          oend = oend + addl;
          iend = pBVar8 + addl;
          addl = (size_t)(bVar1 & 0xf);
          UVar3 = LZ4_readLE16(iend);
          uStack_190 = (ulong)UVar3;
          iend = iend + 2;
          offset = (size_t)(oend + -uStack_190);
          if (((addl != 0xf) && (7 < uStack_190)) && ((local_120 == 1 || (local_128 <= offset)))) {
            *(undefined8 *)oend = *(undefined8 *)offset;
            *(undefined8 *)(oend + 8) = *(undefined8 *)(offset + 8);
            *(undefined2 *)(oend + 0x10) = *(undefined2 *)(offset + 0x10);
            pBVar8 = oend + addl + 4;
            goto LAB_004e9e8e;
          }
        }
        if (addl == 0xf) {
          local_20 = pBVar4 + -4;
          local_18 = &iend;
          s_2._4_4_ = 0;
          local_38 = 0;
          do {
            length_2 = (Rvl_t)**local_18;
            *local_18 = *local_18 + 1;
            local_38 = length_2 + local_38;
            if (local_20 < *local_18) {
              local_10 = -1;
              break;
            }
            local_10 = local_38;
          } while (length_2 == 0xff);
          if ((local_10 == -1) || (addl = local_10 + 0xf, oend + addl < oend)) goto LAB_004eac20;
        }
        local_238 = addl + 4;
        if ((dictSize < 0x10000) && (ip + offset < local_128)) {
LAB_004eac20:
          return -1 - ((int)iend - (int)local_108);
        }
        if ((local_120 == 2) && (offset < local_128)) {
          addl = local_238;
          if (pBVar5 + -5 < oend + local_238) {
            if (local_11c == 0) goto LAB_004eac20;
            local_230 = local_238;
            if ((ulong)((long)pBVar5 - (long)oend) <= local_238) {
              local_230 = (long)pBVar5 - (long)oend;
            }
            addl = local_230;
          }
          if ((long)local_128 - offset < addl) {
            __n = (long)local_128 - offset;
            __n_00 = addl - __n;
            memcpy(oend,(void *)(local_220 - __n),__n);
            pBVar6 = oend + __n;
            if ((ulong)((long)pBVar6 - (long)local_128) < __n_00) {
              mlen = (size_t)local_128;
              oend = pBVar6;
              while (pBVar8 = oend, oend < pBVar6 + __n_00) {
                *oend = *(BYTE *)mlen;
                mlen = mlen + 1;
                oend = oend + 1;
              }
            }
            else {
              memcpy(pBVar6,local_128,__n_00);
              pBVar8 = pBVar6 + __n_00;
            }
          }
          else {
            memmove(oend,(void *)(local_220 - ((long)local_128 - offset)),addl);
            pBVar8 = oend + addl;
          }
          goto LAB_004e9e8e;
        }
        pBVar8 = oend + local_238;
        if ((local_11c == 0) || (pBVar8 <= pBVar5 + -0xc)) {
          if (uStack_190 < 8) {
            LZ4_write32(oend,0);
            *oend = *(BYTE *)offset;
            oend[1] = *(BYTE *)(offset + 1);
            oend[2] = *(BYTE *)(offset + 2);
            oend[3] = *(BYTE *)(offset + 3);
            uVar2 = inc32table[uStack_190];
            *(undefined4 *)(oend + 4) = *(undefined4 *)(offset + uVar2);
            offset = (long)(offset + uVar2) - (long)dec64table[uStack_190];
          }
          else {
            *(undefined8 *)oend = *(undefined8 *)offset;
            offset = offset + 8;
          }
          pBVar6 = oend + 8;
          if (pBVar5 + -0xc < pBVar8) {
            pBVar7 = pBVar5 + -7;
            if (pBVar5 + -5 < pBVar8) goto LAB_004eac20;
            oend = pBVar6;
            if (pBVar6 < pBVar7) {
              local_d8 = offset;
              e_1 = (BYTE *)offset;
              s_3 = pBVar6;
              do {
                *(undefined8 *)s_3 = *(undefined8 *)e_1;
                s_3 = s_3 + 8;
                e_1 = e_1 + 8;
              } while (s_3 < pBVar7);
              offset = (size_t)(pBVar7 + (offset - (long)pBVar6));
              oend = pBVar7;
              local_d0 = pBVar6;
              d_1 = pBVar7;
              local_f8 = pBVar7;
            }
            while (oend < pBVar8) {
              *oend = *(BYTE *)offset;
              offset = offset + 1;
              oend = oend + 1;
            }
          }
          else {
            *(undefined8 *)pBVar6 = *(undefined8 *)offset;
            if (0x10 < local_238) {
              local_a0 = oend + 0x10;
              local_a8 = (BYTE *)(offset + 8);
              e_2 = local_a8;
              s_4 = local_a0;
              do {
                *(undefined8 *)s_4 = *(undefined8 *)e_2;
                s_4 = s_4 + 8;
                e_2 = e_2 + 8;
                local_c8 = pBVar8;
                d_2 = pBVar8;
              } while (s_4 < pBVar8);
            }
          }
          goto LAB_004e9e8e;
        }
        if ((ulong)((long)pBVar5 - (long)oend) <= local_238) {
          local_238 = (long)pBVar5 - (long)oend;
        }
        pBVar8 = oend + local_238;
        if (oend < (BYTE *)(offset + local_238)) {
          while (oend < pBVar8) {
            *oend = *(BYTE *)offset;
            offset = offset + 1;
            oend = oend + 1;
          }
        }
        else {
          memcpy(oend,(void *)offset,local_238);
        }
        oend = pBVar8;
        if (pBVar8 != pBVar5) goto LAB_004e9e8e;
LAB_004eac07:
        local_fc = (int)oend - (int)local_110;
      }
    }
  }
  return local_fc;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int maxOutputSize,
                                     const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}